

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
::CreateTest(TestFactoryImpl<optTyped_swapNotEmptyWithNotEmpty_Test<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>_>
             *this)

{
  optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
  *this_00;
  
  this_00 = (optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
             *)operator_new(0x28);
  anon_unknown.dwarf_df08::
  optTyped<mp::opt<double,_mp::opt_null_type_policy<double,_(anonymous_namespace)::null_floating<double>_>_>_>
  ::optTyped(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001cab50;
  return &this_00->super_Test;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }